

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O1

void hdpc_generate_mat_faster(m256v *H,parameters *P)

{
  int iVar1;
  uint8_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int m;
  uint32_t uVar6;
  long lVar7;
  m256v G_HDPC;
  m256v I_H;
  m256v mStack_58;
  m256v local_40;
  
  m256v_get_subview(&mStack_58,H,0,0,P->H,P->S + P->Kprime);
  if (0 < P->H) {
    uVar2 = '\x01';
    lVar7 = 0;
    do {
      mStack_58.e[(long)P->S + (long)P->Kprime + mStack_58.rstride * lVar7 + -1] = uVar2;
      uVar2 = gf256_mul(uVar2,'\x02');
      lVar7 = lVar7 + 1;
    } while (lVar7 < P->H);
  }
  uVar3 = (P->Kprime + P->S) - 2;
  if (-1 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
    do {
      m = P->H;
      if (0 < m) {
        lVar7 = 0;
        do {
          uVar2 = gf256_mul('\x02',mStack_58.e[uVar5 + 1 + mStack_58.rstride * lVar7]);
          mStack_58.e[uVar5 + mStack_58.rstride * lVar7] = uVar2;
          lVar7 = lVar7 + 1;
          m = P->H;
        } while (lVar7 < m);
      }
      iVar1 = (int)uVar5;
      uVar6 = iVar1 + 1;
      uVar4 = Rand(uVar6,6,m);
      uVar2 = gf256_add('\x01',mStack_58.e[uVar5 + mStack_58.rstride * (long)(int)uVar4]);
      mStack_58.e[uVar5 + mStack_58.rstride * (long)(int)uVar4] = uVar2;
      uVar6 = Rand(uVar6,7,P->H + -1);
      lVar7 = (long)(int)((uVar6 + uVar4 + 1) % (uint)P->H);
      uVar2 = gf256_add('\x01',mStack_58.e[uVar5 + mStack_58.rstride * lVar7]);
      mStack_58.e[uVar5 + lVar7 * mStack_58.rstride] = uVar2;
      uVar5 = uVar5 - 1;
    } while (0 < iVar1);
  }
  m256v_get_subview(&local_40,H,0,P->S + P->Kprime,P->H,P->H);
  m256v_clear(&local_40);
  if (0 < P->H) {
    lVar7 = 0;
    do {
      local_40.e[lVar7 + local_40.rstride * lVar7] = '\x01';
      lVar7 = lVar7 + 1;
    } while (lVar7 < P->H);
  }
  return;
}

Assistant:

void hdpc_generate_mat_faster(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create G_HDPC */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&G_HDPC, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}
	for (int j = P->Kprime + P->S - 2; j >= 0; --j) {
		/* Copy over previous column, multiplied by alpha */
		for (int i = 0; i < P->H; ++i) {
			m256v_set_el(&G_HDPC, i, j,
			  gf256_mul(2, m256v_get_el(&G_HDPC, i, j + 1)));
		}

		/* Add in the two flipped positions */
		int a = Rand(j + 1, 6, P->H);
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
		a = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&G_HDPC, a, j,
		  gf256_add(1, m256v_get_el(&G_HDPC, a, j)));
	}

	/* Create I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}
}